

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O2

DdNode * Cudd_bddIteConstant(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  bool bVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  uint *puVar7;
  DdNode *pDVar8;
  uint uVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  uint uVar13;
  uint uVar14;
  DdNode *pDVar15;
  DdNode *pDVar16;
  DdNode *g_1;
  DdNode *pDVar17;
  byte local_58;
  ulong local_48;
  
  pDVar6 = dd->one;
  if (pDVar6 == f) {
    return g;
  }
  pDVar11 = (DdNode *)((ulong)pDVar6 ^ 1);
  if (pDVar11 == f) {
    return h;
  }
  pDVar5 = g;
  if ((DdNode *)((ulong)g ^ 1) == f) {
    pDVar5 = pDVar11;
  }
  if (g == f) {
    pDVar5 = pDVar6;
  }
  pDVar15 = h;
  if ((DdNode *)((ulong)h ^ 1) == f) {
    pDVar15 = pDVar6;
  }
  if (h == f) {
    pDVar15 = pDVar11;
  }
  if (pDVar5 == pDVar15) {
    return pDVar5;
  }
  pDVar3 = (DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe);
  uVar9 = pDVar3->index;
  pDVar17 = (DdNode *)0x1;
  if (((ulong)uVar9 == 0x7fffffff) && (*(int *)((ulong)pDVar15 & 0xfffffffffffffffe) == 0x7fffffff))
  {
    return (DdNode *)0x1;
  }
  if (pDVar5 == (DdNode *)((ulong)pDVar15 ^ 1)) {
    return (DdNode *)0x1;
  }
  puVar7 = (uint *)((ulong)f & 0xfffffffffffffffe);
  uVar14 = 0x7fffffff;
  uVar13 = 0x7fffffff;
  if ((ulong)*puVar7 != 0x7fffffff) {
    uVar13 = dd->perm[*puVar7];
  }
  pDVar10 = (DdNode *)((ulong)pDVar15 & 0xfffffffffffffffe);
  if (uVar9 != 0x7fffffff) {
    uVar14 = dd->perm[uVar9];
  }
  uVar9 = 0x7fffffff;
  if ((ulong)pDVar10->index != 0x7fffffff) {
    uVar9 = dd->perm[pDVar10->index];
  }
  pDVar4 = pDVar5;
  pDVar8 = f;
  pDVar12 = pDVar15;
  if (pDVar6 == pDVar3) {
    if (uVar9 < uVar13) {
LAB_0064840e:
      pDVar8 = (DdNode *)((ulong)pDVar15 ^ 1);
      pDVar12 = (DdNode *)((ulong)f ^ 1);
      if (pDVar5 == pDVar6) {
        pDVar8 = pDVar15;
        pDVar12 = f;
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (uVar13 != uVar9) goto LAB_006483eb;
      if ((long)((ulong)((uint)pDVar15 & 1) + pDVar10->Id * 2) <
          (long)((ulong)((uint)f & 1) + *(long *)(puVar7 + 8) * 2)) goto LAB_0064840e;
    }
  }
  else {
    bVar1 = true;
    if (pDVar6 == pDVar10) {
      if (uVar13 <= uVar14) {
        if (uVar13 != uVar14) goto LAB_006483eb;
        if ((long)((ulong)((uint)f & 1) + *(long *)(puVar7 + 8) * 2) <=
            (long)((ulong)((uint)pDVar5 & 1) + pDVar3->Id * 2)) goto LAB_006484b7;
      }
      pDVar8 = (DdNode *)((ulong)pDVar5 ^ 1);
      pDVar4 = (DdNode *)((ulong)f ^ 1);
      if (pDVar15 != pDVar6) {
        pDVar8 = pDVar5;
        pDVar4 = f;
      }
      bVar1 = false;
    }
    else {
LAB_006483eb:
      bVar1 = true;
    }
  }
LAB_006484b7:
  if (((ulong)pDVar8 & 1) == 0) {
    pDVar3 = pDVar12;
    pDVar10 = pDVar4;
    if (((ulong)pDVar4 & 1) == 0) {
      pDVar16 = pDVar12;
      pDVar3 = pDVar4;
      pDVar10 = pDVar8;
      if (bVar1) {
        pDVar16 = pDVar15;
        pDVar3 = pDVar5;
        pDVar10 = f;
      }
      local_58 = 0;
      local_48 = 0;
      pDVar5 = pDVar12;
      pDVar12 = pDVar4;
      pDVar4 = pDVar16;
      goto LAB_00648543;
    }
  }
  else {
    pDVar8 = (DdNode *)((ulong)pDVar8 & 0xfffffffffffffffe);
    pDVar3 = pDVar4;
    pDVar10 = pDVar12;
    if (((ulong)pDVar12 & 1) == 0) {
      local_58 = 0;
      local_48 = 0;
      pDVar5 = pDVar4;
      pDVar3 = pDVar12;
      pDVar10 = pDVar8;
      goto LAB_00648543;
    }
  }
  pDVar12 = (DdNode *)((ulong)pDVar10 & 0xfffffffffffffffe);
  pDVar4 = (DdNode *)((ulong)pDVar3 ^ 1);
  local_48 = 1;
  local_58 = 1;
  pDVar5 = pDVar4;
  pDVar3 = pDVar12;
  pDVar10 = pDVar8;
LAB_00648543:
  uVar13 = 0x7fffffff;
  uVar9 = 0x7fffffff;
  if ((ulong)pDVar8->index != 0x7fffffff) {
    uVar9 = dd->perm[pDVar8->index];
  }
  if ((ulong)pDVar12->index != 0x7fffffff) {
    uVar13 = dd->perm[pDVar12->index];
  }
  uVar14 = 0x7fffffff;
  if ((ulong)*(uint *)((ulong)pDVar5 & 0xfffffffffffffffe) != 0x7fffffff) {
    uVar14 = dd->perm[*(uint *)((ulong)pDVar5 & 0xfffffffffffffffe)];
  }
  pDVar5 = cuddConstantLookup(dd,0x6a,pDVar10,pDVar3,pDVar4);
  if (pDVar5 == (DdNode *)0x0) {
    uVar2 = uVar13;
    if (uVar14 < uVar13) {
      uVar2 = uVar14;
    }
    if (((uVar2 <= uVar9) || ((pDVar10->type).kids.T != pDVar6)) ||
       ((pDVar10->type).kids.E != pDVar11)) {
      pDVar11 = pDVar10;
      pDVar6 = pDVar10;
      if (uVar9 <= uVar2) {
        pDVar6 = (pDVar10->type).kids.T;
        pDVar11 = (pDVar10->type).kids.E;
        uVar2 = uVar9;
      }
      pDVar5 = pDVar3;
      pDVar15 = pDVar3;
      if (uVar13 == uVar2) {
        pDVar5 = (pDVar3->type).kids.T;
        pDVar15 = (pDVar3->type).kids.E;
      }
      pDVar17 = pDVar4;
      pDVar12 = pDVar4;
      if (uVar14 == uVar2) {
        pDVar17 = *(DdNode **)(((ulong)pDVar4 & 0xfffffffffffffffe) + 0x10);
        pDVar12 = *(DdNode **)(((ulong)pDVar4 & 0xfffffffffffffffe) + 0x18);
        if (((ulong)pDVar4 & 1) != 0) {
          pDVar17 = (DdNode *)((ulong)pDVar17 ^ 1);
          pDVar12 = (DdNode *)((ulong)pDVar12 ^ 1);
        }
      }
      pDVar17 = Cudd_bddIteConstant(dd,pDVar6,pDVar5,pDVar17);
      if (((pDVar17 == (DdNode *)0x1) ||
          (*(int *)((ulong)pDVar17 & 0xfffffffffffffffe) != 0x7fffffff)) ||
         ((pDVar6 = Cudd_bddIteConstant(dd,pDVar11,pDVar15,pDVar12), pDVar6 == (DdNode *)0x1 ||
          ((pDVar17 != pDVar6 || (*(int *)((ulong)pDVar6 & 0xfffffffffffffffe) != 0x7fffffff)))))) {
        pDVar17 = (DdNode *)0x1;
        cuddCacheInsert(dd,0x6a,pDVar10,pDVar3,pDVar4,(DdNode *)0x1);
      }
      else {
        cuddCacheInsert(dd,0x6a,pDVar10,pDVar3,pDVar4,pDVar17);
        pDVar17 = (DdNode *)(local_48 ^ (ulong)pDVar17);
      }
    }
  }
  else {
    pDVar17 = (DdNode *)((ulong)(local_58 & pDVar5 != (DdNode *)0x1) ^ (ulong)pDVar5);
  }
  return pDVar17;
}

Assistant:

DdNode *
Cudd_bddIteConstant(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode       *r, *Fv, *Fnv, *Gv, *Gnv, *H, *Hv, *Hnv, *t, *e;
    DdNode       *one = DD_ONE(dd);
    DdNode       *zero = Cudd_Not(one);
    int          comple;
    unsigned int topf, topg, toph, v;

    statLine(dd);
    /* Trivial cases. */
    if (f == one)                       /* ITE(1,G,H) => G */
        return(g);
    
    if (f == zero)                      /* ITE(0,G,H) => H */
        return(h);
    
    /* f now not a constant. */
    bddVarToConst(f, &g, &h, one);      /* possibly convert g or h */
                                        /* to constants */

    if (g == h)                         /* ITE(F,G,G) => G */
        return(g);

    if (Cudd_IsConstant(g) && Cudd_IsConstant(h)) 
        return(DD_NON_CONSTANT);        /* ITE(F,1,0) or ITE(F,0,1) */
                                        /* => DD_NON_CONSTANT */
    
    if (g == Cudd_Not(h))
        return(DD_NON_CONSTANT);        /* ITE(F,G,G') => DD_NON_CONSTANT */
                                        /* if F != G and F != G' */
    
    comple = bddVarToCanonical(dd, &f, &g, &h, &topf, &topg, &toph);

    /* Cache lookup. */
    r = cuddConstantLookup(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple && r != DD_NON_CONSTANT));
    }

    v = ddMin(topg, toph);

    /* ITE(F,G,H) = (v,G,H) (non constant) if F = (v,1,0), v < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        return(DD_NON_CONSTANT);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf, v);             /* v = top_var(F,G,H) */
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }

    if (topg == v) {
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }

    if (toph == v) {
        H = Cudd_Regular(h);
        Hv = cuddT(H); Hnv = cuddE(H);
        if (Cudd_IsComplement(h)) {
            Hv = Cudd_Not(Hv);
            Hnv = Cudd_Not(Hnv);
        }
    } else {
        Hv = Hnv = h;
    }

    /* Recursion. */
    t = Cudd_bddIteConstant(dd, Fv, Gv, Hv);
    if (t == DD_NON_CONSTANT || !Cudd_IsConstant(t)) {
        cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    e = Cudd_bddIteConstant(dd, Fnv, Gnv, Hnv);
    if (e == DD_NON_CONSTANT || !Cudd_IsConstant(e) || t != e) {
        cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, t);
    return(Cudd_NotCond(t,comple));

}